

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O2

void __thiscall
el::base::utils::
Registry<el::Logger,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::registerNew(Registry<el::Logger,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *uniqKey,
             Logger *ptr)

{
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,el::Logger*>,std::allocator<std::pair<std::__cxx11::string_const,el::Logger*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  *p_Var1;
  string asStack_48 [32];
  Logger *local_28;
  
  unregister(this,uniqKey);
  p_Var1._0_4_ = (_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,el::Logger*>,std::allocator<std::pair<std::__cxx11::string_const,el::Logger*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)(*(this->
                      super_AbstractRegistry<el::Logger,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_el::Logger_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_el::Logger_*>_>_>_>
                      ).super_ThreadSafe._vptr_ThreadSafe[0xb])(this);
  ::std::__cxx11::string::string(asStack_48,(string *)uniqKey);
  local_28 = ptr;
  ::std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,el::Logger*>,std::allocator<std::pair<std::__cxx11::string_const,el::Logger*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::pair<std::__cxx11::string,el::Logger*>>(p_Var1._0_4_,asStack_48);
  ::std::__cxx11::string::~string(asStack_48);
  return;
}

Assistant:

virtual void registerNew(const T_Key& uniqKey, T_Ptr* ptr) ELPP_FINAL {
    unregister(uniqKey);
    this->list().insert(std::make_pair(uniqKey, ptr));
  }